

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

string * __thiscall
cmFortranParser_s::SModName
          (string *__return_storage_ptr__,cmFortranParser_s *this,string *mod_name,string *sub_name)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  byte local_52;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *SModExt;
  string *sub_name_local;
  string *mod_name_local;
  cmFortranParser_s *this_local;
  
  SModExt = sub_name;
  sub_name_local = mod_name;
  mod_name_local = (string *)this;
  this_local = (cmFortranParser_s *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  local_52 = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)&(this->Compiler).SModExt);
  }
  else {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,".mod",&local_51);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  local_30 = &local_50;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_a8,sub_name_local,&(this->Compiler).SModSep);
    std::operator+(&local_88,&local_a8,SModExt);
    std::operator+(__return_storage_ptr__,&local_88,local_30);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    std::operator+(__return_storage_ptr__,SModExt,local_30);
  }
  local_68 = 1;
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFortranParser_s::SModName(std::string const& mod_name,
                                        std::string const& sub_name) const
{
  std::string const& SModExt =
    this->Compiler.SModExt.empty() ? ".mod" : this->Compiler.SModExt;
  // An empty separator means that the compiler does not use a prefix.
  if (this->Compiler.SModSep.empty()) {
    return sub_name + SModExt;
  }
  return mod_name + this->Compiler.SModSep + sub_name + SModExt;
}